

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void DrawMarker(FTexture *tex,double x,double y,int yadjust,INTBOOL flip,double xscale,double yscale
               ,int translation,double alpha,DWORD fillcolor,FRenderStyle renderstyle)

{
  int iVar1;
  DFrameBuffer *this;
  double img;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  FRemapTable *pFVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  DWORD fillcolor_local;
  double alpha_local;
  int translation_local;
  double yscale_local;
  double xscale_local;
  INTBOOL flip_local;
  int yadjust_local;
  double y_local;
  double x_local;
  FTexture *tex_local;
  FRenderStyle renderstyle_local;
  
  if ((tex != (FTexture *)0x0) && (tex->UseType != '\r')) {
    _flip_local = y;
    y_local = x;
    x_local = (double)tex;
    tex_local._4_4_ = renderstyle;
    iVar2 = FIntCVar::operator_cast_to_int(&am_rotate);
    if ((iVar2 == 1) ||
       ((iVar2 = FIntCVar::operator_cast_to_int(&am_rotate), iVar2 == 2 && ((viewactive & 1U) != 0))
       )) {
      AM_rotatePoint(&y_local,(double *)&flip_local);
    }
    img = x_local;
    this = screen;
    dVar9 = MTOF(y_local - m_x);
    iVar3 = (int)dVar9 + f_x;
    dVar9 = (double)f_h;
    dVar10 = MTOF(_flip_local - m_y);
    iVar4 = (int)(dVar9 - dVar10) + yadjust + f_y;
    dVar9 = FTexture::GetScaledWidthDouble((FTexture *)x_local);
    dVar11 = (double)CleanXfac;
    dVar10 = FTexture::GetScaledHeightDouble((FTexture *)x_local);
    iVar1 = f_y;
    iVar2 = f_x;
    dVar12 = (double)CleanYfac;
    iVar7 = f_y + f_h;
    iVar8 = f_x + f_w;
    pFVar6 = TranslationToTable(translation);
    uVar5 = FRenderStyle::operator_cast_to_unsigned_int((FRenderStyle *)((long)&tex_local + 4));
    DCanvas::DrawTexture
              ((DCanvas *)this,(FTexture *)img,(double)iVar3,(double)iVar4,0x400013af,
               dVar9 * dVar11 * xscale,dVar10 * dVar12 * yscale,alpha,0x400013b0,0x400013a1,
               (ulong)(uint)iVar1,0x400013a2,iVar7,0x400013a3,iVar2,0x400013a4,iVar8,0x40001395,flip
               ,0x4000138e,pFVar6,0x4000138c,0x4000138d,fillcolor,0x400013a9,uVar5,0);
  }
  return;
}

Assistant:

static void DrawMarker (FTexture *tex, double x, double y, int yadjust,
	INTBOOL flip, double xscale, double yscale, int translation, double alpha, DWORD fillcolor, FRenderStyle renderstyle)
{
	if (tex == NULL || tex->UseType == FTexture::TEX_Null)
	{
		return;
	}
	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotatePoint (&x, &y);
	}
	screen->DrawTexture (tex, CXMTOF(x) + f_x, CYMTOF(y) + yadjust + f_y,
		DTA_DestWidthF, tex->GetScaledWidthDouble() * CleanXfac * xscale,
		DTA_DestHeightF, tex->GetScaledHeightDouble() * CleanYfac * yscale,
		DTA_ClipTop, f_y,
		DTA_ClipBottom, f_y + f_h,
		DTA_ClipLeft, f_x,
		DTA_ClipRight, f_x + f_w,
		DTA_FlipX, flip,
		DTA_Translation, TranslationToTable(translation),
		DTA_AlphaF, alpha,
		DTA_FillColor, fillcolor,
		DTA_RenderStyle, DWORD(renderstyle),
		TAG_DONE);
}